

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

QString * __thiscall
QMimeXMLProvider::genericIcon(QString *__return_storage_ptr__,QMimeXMLProvider *this,QString *name)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QMimeTypeXMLData QStack_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QMimeTypeXMLData>::value(&QStack_88,&this->m_nameMimeTypeMap,name);
  qVar3 = QStack_88.genericIconName.d.size;
  pcVar2 = QStack_88.genericIconName.d.ptr;
  pDVar1 = QStack_88.genericIconName.d.d;
  QStack_88.genericIconName.d.d = (Data *)0x0;
  QStack_88.genericIconName.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar2;
  QStack_88.genericIconName.d.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_88.globPatterns.d);
  if (&(QStack_88.iconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(QStack_88.iconName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(QStack_88.genericIconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(QStack_88.genericIconName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&QStack_88.localeComments);
  if (&(QStack_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_88.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeXMLProvider::genericIcon(const QString &name)
{
    return m_nameMimeTypeMap.value(name).genericIconName;
}